

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O2

deUint32 deBitMask32(int leastSignificantBitNdx,int numBits)

{
  if (leastSignificantBitNdx < 0x20 && numBits < 0x20) {
    return ~(-1 << ((byte)numBits & 0x1f)) << ((byte)leastSignificantBitNdx & 0x1f);
  }
  return -(uint)(leastSignificantBitNdx != 0x20 || numBits != 0);
}

Assistant:

DE_INLINE deUint32 deBitMask32 (int leastSignificantBitNdx, int numBits)
{
	DE_ASSERT(deInRange32(leastSignificantBitNdx, 0, 32));
	DE_ASSERT(deInRange32(numBits, 0, 32));
	DE_ASSERT(deInRange32(leastSignificantBitNdx+numBits, 0, 32));

	if (numBits < 32 && leastSignificantBitNdx < 32)
		return ((1u<<numBits)-1u) << (deUint32)leastSignificantBitNdx;
	else if (numBits == 0 && leastSignificantBitNdx == 32)
		return 0u;
	else
	{
		DE_ASSERT(numBits == 32 && leastSignificantBitNdx == 0);
		return 0xFFFFFFFFu;
	}
}